

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O1

ostream * __thiscall cppcms::http::response::out(response *this)

{
  _Atomic_word *p_Var1;
  size_t *psVar2;
  io_mode_type iVar3;
  _data *p_Var4;
  element_type *peVar5;
  bool bVar6;
  service *psVar7;
  cached_settings *pcVar8;
  _List_node_base *p_Var9;
  long lVar10;
  session_interface *this_00;
  connection *pcVar11;
  runtime_error *this_01;
  int iVar12;
  undefined1 local_70 [40];
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((*(uint *)&this->field_0x1c & 2) != 0) goto LAB_001cef7a;
  if ((*(uint *)&this->field_0x1c & 8) != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x30);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"Request for output stream for finalized request is illegal","");
    booster::runtime_error::runtime_error(this_01,(string *)local_70);
    *(undefined ***)this_01 = &PTR__runtime_error_00287810;
    (this_01->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
    __cxa_throw(this_01,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  iVar3 = this->io_mode_;
  psVar7 = http::context::service(this->context_);
  pcVar8 = service::cached_settings(psVar7);
  p_Var4 = (this->d).ptr_;
  iVar12 = p_Var4->required_buffer_size;
  peVar5 = (p_Var4->conn).
           super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (iVar3 - asynchronous < 2) {
    if (iVar12 == -1) {
      iVar12 = (pcVar8->service).async_output_buffer_size;
    }
    local_30._M_pi =
         (p_Var4->conn).super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30._M_pi)->_M_weak_count = (local_30._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_30._M_pi)->_M_weak_count = (local_30._M_pi)->_M_weak_count + 1;
      }
    }
    (p_Var4->buffered).super_basic_device.buffer_size_ = (long)iVar12;
    local_38 = peVar5;
    details::basic_device::do_setp(&(p_Var4->buffered).super_basic_device);
    (p_Var4->buffered).super_basic_device.conn_.
    super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(p_Var4->buffered).super_basic_device.conn_.
                super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_30);
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_30._M_pi)->_M_weak_count;
        iVar12 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar12 = (local_30._M_pi)->_M_weak_count;
        (local_30._M_pi)->_M_weak_count = iVar12 + -1;
      }
      if (iVar12 == 1) {
        (*(local_30._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    p_Var4 = (this->d).ptr_;
    std::ios::rdbuf((streambuf *)(&p_Var4->output + *(long *)(*(long *)&p_Var4->output + -0x18)));
    p_Var4 = (this->d).ptr_;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)&p_Var4->buffered;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar2 = &(p_Var4->buffers).
              super__List_base<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    lVar10 = 0x160;
    if (this->io_mode_ == asynchronous_raw) {
LAB_001ceda9:
      (&(((this->d).ptr_)->headers).headers_._M_t._M_impl.field_0x0)[lVar10] = 1;
    }
  }
  else {
    if (iVar12 == -1) {
      iVar12 = (pcVar8->service).output_buffer_size;
    }
    local_40._M_pi =
         (p_Var4->conn).super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_40._M_pi)->_M_weak_count = (local_40._M_pi)->_M_weak_count + 1;
      }
    }
    (p_Var4->output_buf).super_basic_device.buffer_size_ = (long)iVar12;
    local_48 = peVar5;
    details::basic_device::do_setp(&(p_Var4->output_buf).super_basic_device);
    (p_Var4->output_buf).super_basic_device.conn_.
    super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(p_Var4->output_buf).super_basic_device.conn_.
                super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_40);
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_40._M_pi)->_M_weak_count;
        iVar12 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar12 = (local_40._M_pi)->_M_weak_count;
        (local_40._M_pi)->_M_weak_count = iVar12 + -1;
      }
      if (iVar12 == 1) {
        (*(local_40._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    p_Var4 = (this->d).ptr_;
    std::ios::rdbuf((streambuf *)(&p_Var4->output + *(long *)(*(long *)&p_Var4->output + -0x18)));
    p_Var4 = (this->d).ptr_;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)&p_Var4->output_buf;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar2 = &(p_Var4->buffers).
              super__List_base<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    lVar10 = 0x3e0;
    if (this->io_mode_ == raw) goto LAB_001ceda9;
  }
  this->field_0x1c = this->field_0x1c | 2;
  bVar6 = need_gzip(this);
  if (bVar6) {
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"gzip","");
    content_encoding(this,(string *)local_70);
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_);
    }
  }
  if ((this->io_mode_ != raw) && (this->io_mode_ != asynchronous_raw)) {
    this_00 = http::context::session(this->context_);
    session_interface::save(this_00);
    pcVar11 = http::context::connection(this->context_);
    (*pcVar11->_vptr_connection[3])(pcVar11,(this->d).ptr_);
  }
  if ((this->field_0x1c & 4) != 0) {
    p_Var4 = (this->d).ptr_;
    lVar10 = *(long *)&p_Var4->output;
    (p_Var4->cached).out_ = *(streambuf **)(&p_Var4->field_0x4f0 + *(long *)(lVar10 + -0x18));
    std::ios::rdbuf((streambuf *)(&p_Var4->output + *(long *)(lVar10 + -0x18)));
    p_Var4 = (this->d).ptr_;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)&p_Var4->cached;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar2 = &(p_Var4->buffers).
              super__List_base<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
  }
  if (bVar6) {
    psVar7 = http::context::service(this->context_);
    pcVar8 = service::cached_settings(psVar7);
    iVar12 = (pcVar8->gzip).level;
    psVar7 = http::context::service(this->context_);
    pcVar8 = service::cached_settings(psVar7);
    p_Var4 = (this->d).ptr_;
    details::gzip_buf::open
              (&p_Var4->zbuf,
               (char *)(p_Var4->buffers).
                       super__List_base<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next,iVar12,
               (ulong)(uint)(pcVar8->gzip).buffer);
    p_Var4 = (this->d).ptr_;
    std::ios::rdbuf((streambuf *)(&p_Var4->output + *(long *)(*(long *)&p_Var4->output + -0x18)));
    p_Var4 = (this->d).ptr_;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)&p_Var4->zbuf;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar2 = &(p_Var4->buffers).
              super__List_base<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
  }
  http::context::locale((context *)local_70);
  std::ios::imbue((locale *)(local_70 + 0x20));
  std::locale::~locale((locale *)(local_70 + 0x20));
  std::locale::~locale((locale *)local_70);
LAB_001cef7a:
  return &((this->d).ptr_)->output;
}

Assistant:

std::ostream &response::out()
{
	if(ostream_requested_)
		return d->output;

	if(finalized_)
		throw cppcms_error("Request for output stream for finalized request is illegal");
	
	if(io_mode_ == asynchronous || io_mode_ == asynchronous_raw)  {
		size_t bsize = context_.service().cached_settings().service.async_output_buffer_size;
		if(d->required_buffer_size != -1)
			bsize = d->required_buffer_size;
		d->buffered.open(d->conn,bsize);
		d->output.rdbuf(&d->buffered);
		d->buffers.push_front(&d->buffered);
		if(io_mode_ == asynchronous_raw)
			d->buffered.raw_mode(true);
	}
	else { 
		size_t bsize = context_.service().cached_settings().service.output_buffer_size;
		if(d->required_buffer_size != -1)
			bsize = d->required_buffer_size;
		d->output_buf.open(d->conn,bsize);
		d->output.rdbuf(&d->output_buf);
		d->buffers.push_front(&d->output_buf);
		if(io_mode_ == raw)
			d->output_buf.raw_mode(true);
	}
	
	ostream_requested_=1;
	
	#ifndef CPPCMS_NO_GZIP
	bool gzip = need_gzip();
	
	if(gzip) {
		content_encoding("gzip");
	}
	#endif

	// Now we shoulde write headers -- before comrpession
	if(io_mode_ != raw && io_mode_ != asynchronous_raw) {
		context_.session().save();
		write_http_headers();
	}
	
	if(copy_to_cache_) {
		d->cached.open(d->output.rdbuf());
		d->output.rdbuf(&d->cached);
		d->buffers.push_front(&d->cached);
	}
	
	#ifndef CPPCMS_NO_GZIP
	if(gzip) {
		int level=context_.service().cached_settings().gzip.level;
		int buffer=context_.service().cached_settings().gzip.buffer;
		d->zbuf.open(d->buffers.front(),level,buffer);
		d->output.rdbuf(&d->zbuf);
		d->buffers.push_front(&d->zbuf);
	}
	#endif
	
	d->output.imbue(context_.locale());
	return d->output;
}